

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O0

void __thiscall CSR::CSR(CSR *this,int r,int c,int nz,int *p,int *ind,double *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int *piVar5;
  double *__s;
  int local_3c;
  int local_38;
  int i_2;
  int i_1;
  int i;
  int *ind_local;
  int *p_local;
  int nz_local;
  int c_local;
  int r_local;
  CSR *this_local;
  
  this->row = 0;
  this->col = 0;
  this->nonzero = 0;
  this->row = r;
  this->col = c;
  this->nonzero = nz;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->row + 1);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar4);
  memset(piVar5,0,uVar4);
  this->ptr = piVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nonzero;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar4);
  memset(piVar5,0,uVar4);
  this->idx = piVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nonzero;
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __s = (double *)operator_new__(uVar4);
  memset(__s,0,uVar4);
  this->val = __s;
  for (i_2 = 0; i_2 < this->row + 1; i_2 = i_2 + 1) {
    this->ptr[i_2] = p[i_2];
  }
  for (local_38 = 0; local_38 < this->nonzero; local_38 = local_38 + 1) {
    this->idx[local_38] = ind[local_38];
  }
  for (local_3c = 0; local_3c < this->nonzero; local_3c = local_3c + 1) {
    this->val[local_3c] = x[local_3c];
  }
  return;
}

Assistant:

CSR::CSR(int r, int c, int nz, int *p, int *ind, double *x)
{
    row = r;
    col = c;
    nonzero = nz;
    ptr = new int[row+1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = p[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = ind[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = x[i];
    }

}